

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phix_manager.c
# Opt level: O2

int write_phixfaix(int coff,int compno,opj_codestream_info_t cstr_info,opj_bool EPHused,int j2klen,
                  opj_cio_t *cio)

{
  long *plVar1;
  int pos;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  unsigned_long_long v;
  int iVar27;
  long lVar28;
  uint uVar29;
  int local_17c;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_120;
  undefined8 local_108;
  ulong uStack_100;
  
  pos = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x66616978,4);
  cio_write(cio,0,1);
  lVar9 = (long)compno;
  lVar16 = (long)cstr_info.numlayers;
  local_17c = 0;
  for (lVar26 = 0; lVar26 <= cstr_info.numdecompos[lVar9]; lVar26 = lVar26 + 1) {
    local_17c = local_17c +
                (cstr_info.tile)->pw[lVar26] * (cstr_info.tile)->ph[lVar26] * cstr_info.numlayers;
  }
  cio_write(cio,(long)local_17c,4);
  v = (long)cstr_info.th * (long)cstr_info.tw;
  cio_write(cio,v,4);
  lVar26 = (long)cstr_info.numcomps;
  uVar3 = 0;
  if (0 < cstr_info.numlayers) {
    uVar3 = (ulong)(uint)cstr_info.numlayers;
  }
  uVar4 = 0;
  if (0 < (int)v) {
    uVar4 = v & 0xffffffff;
  }
  lVar5 = lVar16 * 0x20;
  lVar6 = lVar26 * lVar16 * 0x20;
  lVar10 = lVar26 * 0x20;
  local_108._0_4_ = 0xffffffff;
  local_108._4_4_ = 0xffffffff;
  uVar29 = 0xffffffff;
  for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
    iVar2 = cstr_info.numdecompos[lVar9];
    lVar11 = (long)(iVar2 + 1);
    local_130 = lVar16 * lVar9 * 0x20 * lVar11;
    local_138 = 0;
    lVar14 = 0;
    iVar27 = 0;
    local_148 = lVar9 << 5;
    local_140 = lVar9 << 5;
    while( true ) {
      uStack_100 = (ulong)uVar29;
      if (iVar2 < lVar14) break;
      uVar18 = (long)cstr_info.tile[uVar8].ph[lVar14] * (long)cstr_info.tile[uVar8].pw[lVar14];
      uVar23 = 0;
      if (0 < (int)uVar18) {
        uVar23 = uVar18 & 0xffffffff;
      }
      lVar17 = (local_138 * uVar18 + lVar9) * lVar5;
      lVar21 = ((compno * (int)uVar18) * lVar11 + lVar14) * lVar5;
      lVar7 = local_148 * uVar18;
      lVar12 = local_140 * uVar18;
      local_120 = local_130;
      for (uVar20 = 0; lVar13 = lVar12, uVar15 = uVar3, lVar19 = lVar7, lVar22 = lVar21,
          lVar24 = local_120, lVar25 = lVar17, uVar20 != uVar23; uVar20 = uVar20 + 1) {
        while (uVar15 != 0) {
          switch(cstr_info.prog) {
          case LRCP:
            plVar1 = (long *)((long)&(cstr_info.tile[uVar8].packet)->start_pos + lVar19);
            lVar28 = *plVar1;
            uStack_100 = plVar1[1];
            break;
          case RLCP:
            plVar1 = (long *)((long)&(cstr_info.tile[uVar8].packet)->start_pos + lVar13);
            lVar28 = *plVar1;
            uStack_100 = plVar1[1];
            break;
          case RPCL:
            plVar1 = (long *)((long)&(cstr_info.tile[uVar8].packet)->start_pos + lVar25);
            lVar28 = *plVar1;
            uStack_100 = plVar1[1];
            break;
          case PCRL:
            plVar1 = (long *)((long)&(cstr_info.tile[uVar8].packet)->start_pos + lVar24);
            lVar28 = *plVar1;
            uStack_100 = plVar1[1];
            break;
          case CPRL:
            plVar1 = (long *)((long)&(cstr_info.tile[uVar8].packet)->start_pos + lVar22);
            lVar28 = *plVar1;
            uStack_100 = plVar1[1];
            break;
          default:
            fwrite("failed to ppix indexing\n",0x18,1,_stderr);
            lVar28 = local_108;
          }
          cio_write(cio,lVar28 - coff,4);
          local_108._4_4_ = (undefined4)((ulong)lVar28 >> 0x20);
          cio_write(cio,(CONCAT44(local_108._4_4_,(uint)uStack_100) - lVar28) + 1,4);
          lVar13 = lVar13 + uVar18 * lVar10;
          uVar15 = uVar15 - 1;
          lVar19 = lVar19 + lVar10 * lVar11 * uVar18;
          lVar22 = lVar22 + 0x20;
          lVar24 = lVar24 + 0x20;
          lVar25 = lVar25 + 0x20;
          local_108 = lVar28;
        }
        lVar17 = lVar17 + lVar6;
        local_120 = local_120 + lVar6 * lVar11;
        lVar21 = lVar21 + lVar5 * lVar11;
        lVar7 = lVar7 + 0x20;
        lVar12 = lVar12 + 0x20;
      }
      iVar27 = iVar27 + (int)uVar3 * (int)uVar23;
      lVar14 = lVar14 + 1;
      local_138 = local_138 + lVar26;
      local_130 = local_130 + lVar5;
      local_148 = local_148 + lVar10;
      local_140 = local_140 + lVar6;
      uVar29 = (uint)uStack_100;
    }
    for (; iVar27 < local_17c; iVar27 = iVar27 + 1) {
      cio_write(cio,0,4);
      cio_write(cio,0,4);
    }
  }
  iVar2 = cio_tell(cio);
  cio_seek(cio,pos);
  cio_write(cio,(long)(iVar2 - pos),4);
  cio_seek(cio,iVar2);
  return iVar2 - pos;
}

Assistant:

int write_phixfaix( int coff, int compno, opj_codestream_info_t cstr_info, opj_bool EPHused, int j2klen, opj_cio_t *cio)
{
  int len, lenp, tileno, version, i, nmax, size_of_coding; /* 4 or 8 */
  opj_tile_info_t *tile_Idx;
  opj_packet_info_t packet;
  int resno, precno, layno, num_packet;
  int numOfres, numOfprec, numOflayers;
  packet.end_ph_pos = packet.start_pos = -1;
  (void)EPHused; /* unused ? */

  if( j2klen > pow( 2, 32)){
    size_of_coding =  8;
    version = 1;
  }
  else{
    size_of_coding = 4;
    version = 0;
  }

  lenp = cio_tell( cio);
  cio_skip( cio, 4);              /* L [at the end]      */
  cio_write( cio, JPIP_FAIX, 4);  /* FAIX                */ 
  cio_write( cio, version,1);     /* Version 0 = 4 bytes */

  nmax = 0;
  for( i=0; i<=cstr_info.numdecompos[compno]; i++)
    nmax += cstr_info.tile[0].ph[i] * cstr_info.tile[0].pw[i] * cstr_info.numlayers;
  
  cio_write( cio, nmax, size_of_coding); /* NMAX */
  cio_write( cio, cstr_info.tw*cstr_info.th, size_of_coding);      /* M    */
  
  for( tileno=0; tileno<cstr_info.tw*cstr_info.th; tileno++){
    tile_Idx = &cstr_info.tile[ tileno];
    
    num_packet = 0;
    numOfres = cstr_info.numdecompos[compno] + 1;

    for( resno=0; resno<numOfres ; resno++){
      numOfprec = tile_Idx->pw[resno]*tile_Idx->ph[resno];
      for( precno=0; precno<numOfprec; precno++){
	numOflayers = cstr_info.numlayers;
	for( layno=0; layno<numOflayers; layno++){
	  
	  switch ( cstr_info.prog){
	  case LRCP:
	    packet = tile_Idx->packet[ ((layno*numOfres+resno)*cstr_info.numcomps+compno)*numOfprec+precno];
	    break;
	  case RLCP:
	    packet = tile_Idx->packet[ ((resno*numOflayers+layno)*cstr_info.numcomps+compno)*numOfprec+precno];
	    break;
	  case RPCL:
	    packet = tile_Idx->packet[ ((resno*numOfprec+precno)*cstr_info.numcomps+compno)*numOflayers+layno];
	    break;
	  case PCRL:
	    packet = tile_Idx->packet[ ((precno*cstr_info.numcomps+compno)*numOfres+resno)*numOflayers + layno];
	    break;
	  case CPRL:
	    packet = tile_Idx->packet[ ((compno*numOfprec+precno)*numOfres+resno)*numOflayers + layno];
	    break;
	  default:
	    fprintf( stderr, "failed to ppix indexing\n");
	  }

	  cio_write( cio, packet.start_pos-coff, size_of_coding);                /* start position */
	  cio_write( cio, packet.end_ph_pos-packet.start_pos+1, size_of_coding); /* length         */
	  
	  num_packet++;
	}
      }
    }

    /* PADDING */
    while( num_packet < nmax){
      cio_write( cio, 0, size_of_coding); /* start position            */
      cio_write( cio, 0, size_of_coding); /* length                    */
      num_packet++;
    }
  }

  len = cio_tell( cio)-lenp;
  cio_seek( cio, lenp);
  cio_write( cio, len, 4);        /* L  */
  cio_seek( cio, lenp+len);

  return len;
}